

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

int stripaccent(int code)

{
  int iVar1;
  uint uVar2;
  
  if (code < 0x8a) {
    return code;
  }
  if (code == 0x8a) {
    iVar1 = 0x53;
  }
  else if (code == 0xff) {
    iVar1 = 0x79;
  }
  else if (code == 0x9a) {
    iVar1 = 0x73;
  }
  else if (code == 0x9e) {
    iVar1 = 0x7a;
  }
  else if (code == 0x9f) {
    iVar1 = 0x59;
  }
  else {
    if (code != 0x8e) {
      if ((code & 0xc0U) != 0) {
        uVar2 = code & 0xdf;
        if (uVar2 - 0xc0 < 6) {
          return code & 0x20U | 0x41;
        }
        if (uVar2 == 199) {
          return 0x43;
        }
        if (((byte)code & 0xdc) == 0xcc) {
          return code & 0x20U | 0x49;
        }
        if ((code & 0xdcU) == 200) {
          return code & 0x20U | 0x45;
        }
        switch(uVar2) {
        case 0xd0:
          return code & 0x20U | 0x44;
        case 0xd1:
          return code & 0x20U | 0x4e;
        case 0xd2:
        case 0xd3:
        case 0xd4:
        case 0xd5:
        case 0xd6:
        case 0xd8:
          return code & 0x20U | 0x4f;
        }
        if (uVar2 - 0xd9 < 4) {
          return code & 0x20U | 0x55;
        }
        if ((char)uVar2 == -0x22) {
          return code & 0x70;
        }
        if (uVar2 == 0xdd) {
          return code & 0x79;
        }
      }
      return code;
    }
    iVar1 = 0x5a;
  }
  return iVar1;
}

Assistant:

static int stripaccent(int code)
{
	if (code < 0x8a)
		return code;
	if (code == 0x8a)	// Latin capital letter S with caron
		return 'S';
	if (code == 0x8e)	// Latin capital letter Z with caron
		return 'Z';
	if (code == 0x9a)	// Latin small letter S with caron
		return 's';
	if (code == 0x9e)	// Latin small letter Z with caron
		return 'z';
	if (code == 0x9f)	// Latin capital letter Y with diaeresis
		return 'Y';
	if (code == 0xff)	// Latin small letter Y with diaeresis
		return 'y';
	// Every other accented character has the high two bits set.
	if ((code & 0xC0) == 0)
		return code;
	// Make lowercase characters uppercase so there are half as many tests.
	int acode = code & 0xDF;
	if (acode >= 0xC0 && acode <= 0xC5)		// A with accents
		return 'A' + (code & 0x20);
	if (acode == 0xC7)						// Cedilla
		return 'C' + (acode & 0x20);
	if (acode >= 0xC8 && acode <= 0xCB)		// E with accents
		return 'E' + (code & 0x20);
	if (acode >= 0xCC && acode <= 0xCF)		// I with accents
		return 'I' + (code & 0x20);
	if (acode == 0xD0)						// Eth
		return 'D' + (code & 0x20);
	if (acode == 0xD1)						// N with tilde
		return 'N' + (code & 0x20);
	if ((acode >= 0xD2 && acode <= 0xD6) ||	// O with accents
		acode == 0xD8)						// O with stroke
		return 'O' + (code & 0x20);
	if (acode >= 0xD9 && acode <= 0xDC)		// U with accents
		return 'U' + (code & 0x20);
	if (acode == 0xDD)						// Y with accute
		return 'Y' + (code & 0x20);
	if (acode == 0xDE)						// Thorn
		return 'P' + (code & 0x20);			// well, it sort of looks like a 'P'
	return code;
}